

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  long *plVar1;
  _Base_ptr *pp_Var2;
  cmExportSet *pcVar3;
  cmGeneratorTarget *pcVar4;
  cmExportInstallFileGenerator *this_00;
  bool bVar5;
  uint uVar6;
  TargetType TVar7;
  PolicyStatus PVar8;
  int iVar9;
  undefined8 *puVar10;
  ostream *poVar11;
  string *psVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  undefined8 uVar17;
  ulong uVar18;
  pointer ppcVar19;
  cmTargetExport **ppcVar20;
  pointer pbVar21;
  bool bVar22;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar23;
  string expectedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  cmTargetExport *te;
  ostringstream e;
  string local_278;
  cmExportInstallFileGenerator *local_258;
  ostream *local_250;
  uint local_244;
  uint local_240;
  uint local_23c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  cmGeneratorTarget *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  cmTargetExport **local_1e8;
  iterator iStack_1e0;
  cmTargetExport **local_1d8;
  undefined1 local_1c8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8 [2];
  ios_base local_138 [264];
  
  local_1e8 = (cmTargetExport **)0x0;
  iStack_1e0._M_current = (cmTargetExport **)0x0;
  local_1d8 = (cmTargetExport **)0x0;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity =
       local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pcVar3 = this->IEGen->ExportSet;
  ppcVar19 = (pcVar3->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar22 = ppcVar19 ==
           (pcVar3->TargetExports).
           super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_250 = os;
  if (!bVar22) {
    local_258 = (cmExportInstallFileGenerator *)&(this->super_cmExportFileGenerator).Namespace;
    pp_Var2 = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_210 = (cmGeneratorTarget *)&(this->super_cmExportFileGenerator).ExportedTargets;
    do {
      std::operator+(&local_208,&local_238,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258)
      ;
      cmGeneratorTarget::GetExportName_abi_cxx11_((string *)local_1c8,(*ppcVar19)->Target);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        uVar17 = local_208.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_1c8._8_8_ + local_208._M_string_length) {
        uVar18 = 0xf;
        if ((cmTargetExport *)local_1c8._0_8_ != (cmTargetExport *)(local_1c8 + 0x10)) {
          uVar18 = local_1c8._16_8_;
        }
        if (uVar18 < local_1c8._8_8_ + local_208._M_string_length) goto LAB_004515f6;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)local_1c8,0,(char *)0x0,(ulong)local_208._M_dataplus._M_p);
      }
      else {
LAB_004515f6:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_208,local_1c8._0_8_);
      }
      plVar1 = puVar10 + 2;
      if ((_Base_ptr *)*puVar10 == (_Base_ptr *)plVar1) {
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar1;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar10[3];
        local_1a8[0]._M_impl._0_8_ = pp_Var2;
      }
      else {
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar1;
        local_1a8[0]._M_impl._0_8_ = (_Base_ptr *)*puVar10;
      }
      local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar10[1];
      *puVar10 = plVar1;
      puVar10[1] = 0;
      *(undefined1 *)plVar1 = 0;
      std::__cxx11::string::_M_append((char *)&local_278,local_1a8[0]._M_impl._0_8_);
      if ((_Base_ptr *)local_1a8[0]._M_impl._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8[0]._M_impl._0_8_,
                        (ulong)((long)&(local_1a8[0]._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if ((cmTargetExport *)local_1c8._0_8_ != (cmTargetExport *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_238,0,(char *)local_238._M_string_length,0x579fa1);
      local_1c8._0_8_ = *ppcVar19;
      pVar23 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>
                         ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                           *)local_210,&((cmTargetExport *)local_1c8._0_8_)->Target);
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"install(EXPORT \"",0x10);
        pcVar3 = this->IEGen->ExportSet;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(pcVar3->Name)._M_dataplus._M_p,
                             (pcVar3->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ...) ",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"includes target \"",0x11);
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_
                            (*(cmGeneratorTarget **)(local_1c8._0_8_ + 0x20));
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"\" more than once in the export set.",0x23);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Error(local_208._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else if (iStack_1e0._M_current == local_1d8) {
        std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::
        _M_realloc_insert<cmTargetExport*const&>
                  ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)&local_1e8,iStack_1e0,
                   (cmTargetExport **)local_1c8);
      }
      else {
        *iStack_1e0._M_current = (cmTargetExport *)local_1c8._0_8_;
        iStack_1e0._M_current = iStack_1e0._M_current + 1;
      }
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_00451d90;
      }
      ppcVar19 = ppcVar19 + 1;
      bVar22 = ppcVar19 ==
               (this->IEGen->ExportSet->TargetExports).
               super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (!bVar22);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,local_250,&local_278)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  if (bVar22) {
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x13])(this);
    local_238._M_dataplus._M_p = (pointer)0x0;
    local_238._M_string_length = 0;
    local_238.field_2._M_allocated_capacity = 0;
    if (local_1e8 == iStack_1e0._M_current) {
      bVar22 = false;
      local_23c = 0;
      uVar6 = 0;
      uVar16 = 0;
    }
    else {
      local_240 = 0;
      bVar22 = false;
      local_244 = 0;
      ppcVar20 = local_1e8;
      local_258 = this;
      uVar14 = 0;
      do {
        pcVar4 = (*ppcVar20)->Target;
        uVar6 = (uint)CONCAT71((int7)((ulong)*ppcVar20 >> 8),1);
        if ((uVar14 & 1) == 0) {
          TVar7 = cmGeneratorTarget::GetType(pcVar4);
          uVar6 = CONCAT31((int3)(TVar7 >> 8),TVar7 != INTERFACE_LIBRARY);
        }
        local_23c = uVar6;
        (*(local_258->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                  (local_258,local_250,pcVar4);
        this_00 = local_258;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1a8[0]._M_impl.super__Rb_tree_header._M_header;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_210 = pcVar4;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
        cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                  (&local_258->super_cmExportFileGenerator,*ppcVar20,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        cmExportFileGenerator::PopulateSourcesInterface
                  (&this_00->super_cmExportFileGenerator,*ppcVar20,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,local_210,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_COMPILE_DEFINITIONS","");
        pcVar4 = local_210;
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,local_210,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,pcVar4,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,pcVar4,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,pcVar4,InstallInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        PVar8 = cmPolicies::PolicyMap::Get(&pcVar4->PolicyMap,CMP0022);
        if ((((PVar8 != WARN) &&
             (PVar8 = cmPolicies::PolicyMap::Get(&pcVar4->PolicyMap,CMP0022), PVar8 != OLD)) &&
            (bVar5 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                               (&local_258->super_cmExportFileGenerator,pcVar4,InstallInterface,
                                (ImportPropertyMap *)local_1a8,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_238), bVar5)) &&
           (local_244 = local_244 & 0xff,
           (local_258->super_cmExportFileGenerator).ExportOld == false)) {
          local_244 = 1;
        }
        TVar7 = cmGeneratorTarget::GetType(pcVar4);
        if (TVar7 == INTERFACE_LIBRARY) {
          bVar22 = true;
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"INTERFACE_SOURCES","")
        ;
        pcVar13 = cmGeneratorTarget::GetProperty(pcVar4,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        local_240 = local_240 & 0xff;
        if (pcVar13 != (char *)0x0) {
          local_240 = 1;
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&local_258->super_cmExportFileGenerator,&local_278,pcVar4,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
        cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                  (&local_258->super_cmExportFileGenerator,pcVar4,(ImportPropertyMap *)local_1a8);
        (*(local_258->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                  (local_258,pcVar4,local_250,local_1a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_1a8);
        ppcVar20 = ppcVar20 + 1;
        this = local_258;
        uVar6 = local_244;
        uVar16 = local_240;
        uVar14 = local_23c;
      } while (ppcVar20 != iStack_1e0._M_current);
    }
    if ((((uVar16 & 1) != 0) || (bVar22)) || ((uVar6 & 1) != 0)) {
      pcVar13 = "2.8.12";
      if (bVar22) {
        pcVar13 = "3.0.0";
      }
      pcVar15 = "3.1.0";
      if ((uVar16 & 1) == 0) {
        pcVar15 = pcVar13;
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                (this,local_250,pcVar15);
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x14])(this,local_250);
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(this,local_250);
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,local_250);
    bVar22 = true;
    if (((char)local_23c != '\0') &&
       (pbVar21 = (this->super_cmExportFileGenerator).Configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       pbVar21 !=
       (this->super_cmExportFileGenerator).Configurations.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      bVar22 = true;
      do {
        iVar9 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])
                          (this,pbVar21,&local_238);
        if ((char)iVar9 == '\0') {
          bVar22 = false;
        }
        pbVar21 = pbVar21 + 1;
      } while (pbVar21 !=
               (this->super_cmExportFileGenerator).Configurations.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])
              (this,local_250,&local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_238);
  }
  else {
LAB_00451d90:
    bVar22 = false;
  }
  if (local_1e8 != (cmTargetExport **)0x0) {
    operator_delete(local_1e8,(long)local_1d8 - (long)local_1e8);
  }
  return bVar22;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (std::vector<cmTargetExport*>::const_iterator tei =
           this->IEGen->GetExportSet()->GetTargetExports()->begin();
         tei != this->IEGen->GetExportSet()->GetTargetExports()->end();
         ++tei) {
      expectedTargets +=
        sep + this->Namespace + (*tei)->Target->GetExportName();
      sep = " ";
      cmTargetExport* te = *tei;
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te);
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str().c_str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (std::vector<cmTargetExport*>::const_iterator tei = allTargets.begin();
       tei != allTargets.end(); ++tei) {
    cmGeneratorTarget* gt = (*tei)->Target;

    requiresConfigFiles =
      requiresConfigFiles || gt->GetType() != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      *tei, cmGeneratorExpression::InstallInterface, properties,
      missingTargets);
    this->PopulateSourcesInterface(*tei,
                                   cmGeneratorExpression::InstallInterface,
                                   properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets);

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties,
            missingTargets) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::vector<std::string>::const_iterator ci =
           this->Configurations.begin();
         ci != this->Configurations.end(); ++ci) {
      if (!this->GenerateImportFileConfig(*ci, missingTargets)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}